

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O2

vector<Expr_*,_std::allocator<Expr_*>_> *
generatePhiAssignments
          (vector<Expr_*,_std::allocator<Expr_*>_> *__return_storage_ptr__,Block *blockEnding,
          Block *nextBlock)

{
  Program *this;
  undefined8 this_00;
  const_block_iterator ppBVar1;
  Value *value;
  PHINode *phi;
  uint i;
  ulong uVar2;
  phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
  __begin1;
  Expr *incoming;
  Expr *phiVar;
  undefined1 local_58 [16];
  Expr *local_48;
  Expr *local_40;
  Expr *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this = blockEnding->func->program;
  local_58 = llvm::BasicBlock::phis();
  while (this_00 = local_58._0_8_, local_58._0_8_ != local_58._8_8_) {
    local_38 = Program::getExpr(this,(Value *)local_58._0_8_);
    for (uVar2 = 0; uVar2 < (*(uint *)(this_00 + 0x14) & 0x7ffffff); uVar2 = uVar2 + 1) {
      ppBVar1 = llvm::PHINode::block_begin((PHINode *)this_00);
      if (ppBVar1[uVar2] == blockEnding->block) {
        value = llvm::PHINode::getOperand((PHINode *)this_00,(uint)uVar2);
        local_40 = Program::getExpr(this,value);
        local_48 = Program::makeExpr<AssignExpr,Expr*&,Expr*&>(this,&local_38,&local_40);
        std::vector<Expr*,std::allocator<Expr*>>::emplace_back<Expr*>
                  ((vector<Expr*,std::allocator<Expr*>> *)__return_storage_ptr__,&local_48);
      }
    }
    llvm::BasicBlock::
    phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
    ::operator++((phi_iterator_impl<const_llvm::PHINode,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>_>
                  *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Expr*> generatePhiAssignments(Block* blockEnding, Block* nextBlock) {
    std::vector<Expr*> exprs;

    Program& program = *blockEnding->func->program;

    for (const auto& phi : nextBlock->block->phis()) {
        Expr* phiVar = program.getExpr(&phi);

        // see if nextBlock declares any incoming value from blockEnding
        for (unsigned i = 0; i < phi.getNumIncomingValues(); ++i) {
            if (phi.getIncomingBlock(i) == blockEnding->block) {
                Expr* incoming = program.getExpr(phi.getIncomingValue(i));
                exprs.push_back(program.makeExpr<AssignExpr>(phiVar, incoming));
            }
        }
    }

    return exprs;
}